

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O0

void Am_Destroy_Menu_Bar(Am_Object *object)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object_Demon *pAVar3;
  Am_Object local_58;
  Am_Demon_Set local_50;
  Am_Object_Demon *local_48;
  Am_Object_Demon *proto_demon;
  Am_Object sub_menu;
  Am_Object local_28;
  Am_Object part;
  Am_Value_List parts;
  Am_Object *object_local;
  
  Am_Value_List::Am_Value_List((Am_Value_List *)&part);
  Am_Object::Am_Object(&local_28);
  Am_Object::Am_Object((Am_Object *)&proto_demon);
  pAVar2 = Am_Object::Get(object,0x82,0);
  Am_Value_List::operator=((Am_Value_List *)&part,pAVar2);
  Am_Value_List::Start((Am_Value_List *)&part);
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)&part);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pAVar2 = Am_Value_List::Get((Am_Value_List *)&part);
    Am_Object::operator=(&local_28,pAVar2);
    bVar1 = Am_Object::Valid(&local_28);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&local_28,0x1d2,0);
      Am_Object::operator=((Am_Object *)&proto_demon,pAVar2);
      Am_Object::Destroy((Am_Object *)&proto_demon);
    }
    Am_Value_List::Next((Am_Value_List *)&part);
  }
  Am_Object_Advanced::Get_Demons((Am_Object_Advanced *)&local_50);
  pAVar3 = Am_Demon_Set::Get_Object_Demon(&local_50,Am_DESTROY_OBJ);
  Am_Demon_Set::~Am_Demon_Set(&local_50);
  local_48 = pAVar3;
  if (pAVar3 != (Am_Object_Demon *)0x0) {
    Am_Object::Am_Object(&local_58,object);
    (*pAVar3)((Am_Object)pAVar3);
    Am_Object::~Am_Object(&local_58);
  }
  Am_Object::~Am_Object((Am_Object *)&proto_demon);
  Am_Object::~Am_Object(&local_28);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&part);
  return;
}

Assistant:

void
Am_Destroy_Menu_Bar(Am_Object object)
{
  Am_Value_List parts;
  Am_Object part;
  Am_Object sub_menu;

  // get all the parts of the given object
  parts = object.Get(Am_GRAPHICAL_PARTS);

  // iterate through the returned list
  for (parts.Start(); !parts.Last(); parts.Next()) {
    // get the current part
    part = parts.Get();

    // is this a valid part?
    if (part.Valid() == true) {
      // get the submenu object and destroy it
      sub_menu = part.Get(Am_SUB_MENU);
      sub_menu.Destroy();
    }
  }

  Am_Object_Demon *proto_demon = ((Am_Object_Advanced &)Am_Menu)
                                     .Get_Demons()
                                     .Get_Object_Demon(Am_DESTROY_OBJ);
  if (proto_demon) {
    proto_demon(object);
  }

  return;
}